

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O2

void __thiscall
QPixmapDropShadowFilter::draw
          (QPixmapDropShadowFilter *this,QPainter *p,QPointF *pos,QPixmap *px,QRectF *src)

{
  long lVar1;
  double dVar2;
  char cVar3;
  CompositionMode CVar4;
  long in_FS_OFFSET;
  undefined1 local_90 [16];
  QPainter blurPainter;
  QSize local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QPainter tmpPainter;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QPixmapFilter).field_0x8;
  cVar3 = QPixmap::isNull();
  if (cVar3 == '\0') {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (QSize)QPixmap::size();
    QImage::QImage((QImage *)&local_58,&local_78,Format_ARGB32_Premultiplied);
    dVar2 = (double)QPixmap::devicePixelRatio();
    QImage::setDevicePixelRatio(dVar2);
    QImage::fill((uint)(QImage *)&local_58);
    _tmpPainter = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter(&tmpPainter,(QPaintDevice *)&local_58);
    CVar4 = (CompositionMode)(QRect *)&tmpPainter;
    QPainter::setCompositionMode(CVar4);
    QPainter::drawPixmap((QPointF *)&tmpPainter,(QPixmap *)(lVar1 + 0x80));
    QPainter::end();
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_90._0_8_ = QImage::size();
    QImage::QImage((QImage *)&local_78,(QSize *)local_90,Format_ARGB32_Premultiplied);
    dVar2 = (double)QPixmap::devicePixelRatio();
    QImage::setDevicePixelRatio(dVar2);
    QImage::fill((uint)&local_78);
    _blurPainter = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter(&blurPainter,(QPaintDevice *)&local_78);
    qt_blurImage(&blurPainter,(QImage *)&local_58,*(double *)(lVar1 + 0xa0),false,true,0);
    QPainter::end();
    QImage::operator=((QImage *)&local_58,(QImage *)&local_78);
    QPainter::begin((QPaintDevice *)&tmpPainter);
    QPainter::setCompositionMode(CVar4);
    local_90 = QImage::rect();
    QPainter::fillRect((QRect *)&tmpPainter,(QColor *)local_90);
    QPainter::end();
    QPainter::drawImage((QPointF *)p,(QImage *)pos);
    QPainter::drawPixmap(p,pos,px,src);
    QPainter::~QPainter(&blurPainter);
    QImage::~QImage((QImage *)&local_78);
    QPainter::~QPainter(&tmpPainter);
    QImage::~QImage((QImage *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapDropShadowFilter::draw(QPainter *p,
                                   const QPointF &pos,
                                   const QPixmap &px,
                                   const QRectF &src) const
{
    Q_D(const QPixmapDropShadowFilter);

    if (px.isNull())
        return;

    QImage tmp(px.size(), QImage::Format_ARGB32_Premultiplied);
    tmp.setDevicePixelRatio(px.devicePixelRatio());
    tmp.fill(0);
    QPainter tmpPainter(&tmp);
    tmpPainter.setCompositionMode(QPainter::CompositionMode_Source);
    tmpPainter.drawPixmap(d->offset, px);
    tmpPainter.end();

    // blur the alpha channel
    QImage blurred(tmp.size(), QImage::Format_ARGB32_Premultiplied);
    blurred.setDevicePixelRatio(px.devicePixelRatio());
    blurred.fill(0);
    QPainter blurPainter(&blurred);
    qt_blurImage(&blurPainter, tmp, d->radius, false, true);
    blurPainter.end();

    tmp = std::move(blurred);

    // blacken the image...
    tmpPainter.begin(&tmp);
    tmpPainter.setCompositionMode(QPainter::CompositionMode_SourceIn);
    tmpPainter.fillRect(tmp.rect(), d->color);
    tmpPainter.end();

    // draw the blurred drop shadow...
    p->drawImage(pos, tmp);

    // Draw the actual pixmap...
    p->drawPixmap(pos, px, src);
}